

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.cpp
# Opt level: O1

void __thiscall setup::task_entry::load(task_entry *this,istream *is,info *i)

{
  uint uVar1;
  int iVar2;
  char buffer_2 [1];
  stored_flag_reader<flags<setup::task_entry::flags_Enum_,_5UL>_> flagreader;
  undefined1 local_51;
  stored_flag_reader<setup::task_entry::flags_Enum_> local_50;
  
  util::encoded_string::load(is,&this->name,i->codepage,(bitset<256UL> *)0x0);
  util::encoded_string::load(is,&this->description,i->codepage,(bitset<256UL> *)0x0);
  util::encoded_string::load(is,&this->group_description,i->codepage,(bitset<256UL> *)0x0);
  util::encoded_string::load(is,&this->components,i->codepage,(bitset<256UL> *)0x0);
  if ((i->version).value < 0x4000100) {
    (this->languages)._M_string_length = 0;
    *(this->languages)._M_dataplus._M_p = '\0';
  }
  else {
    util::encoded_string::load(is,&this->languages,i->codepage,(bitset<256UL> *)0x0);
  }
  uVar1 = (i->version).value;
  if ((uVar1 < 0x4000000) &&
     ((uVar1 < 0x1031800 || (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 4) == 0))))
  {
    (this->check)._M_string_length = 0;
    *(this->check)._M_dataplus._M_p = '\0';
  }
  else {
    util::encoded_string::load(is,&this->check,i->codepage,(bitset<256UL> *)0x0);
  }
  uVar1 = (i->version).value;
  if (uVar1 < 0x4000000) {
    iVar2 = 0;
    if ((uVar1 < 0x3000300) ||
       (iVar2 = 0, ((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 4) == 0))
    goto LAB_001432bc;
  }
  std::istream::read((char *)is,(long)&local_50);
  iVar2 = (int)local_50.pad_bits;
LAB_001432bc:
  this->level = iVar2;
  uVar1 = (i->version).value;
  if ((uVar1 < 0x4000000) &&
     ((uVar1 < 0x3000400 || (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 4) == 0))))
  {
    this->used = true;
  }
  else {
    std::istream::read((char *)is,(long)&local_50);
    this->used = (char)local_50.pad_bits != '\0';
  }
  windows_version_range::load(&this->winver,is,&i->version);
  local_50.pad_bits = 0x20;
  local_50.pos = 0;
  local_50.buffer = '\0';
  local_50.result._flags.super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
  local_50.bytes = 0;
  local_50.stream = is;
  stored_flag_reader<setup::task_entry::flags_Enum_>::add(&local_50,Exclusive);
  stored_flag_reader<setup::task_entry::flags_Enum_>::add(&local_50,Unchecked);
  if (0x20004ff < (i->version).value) {
    stored_flag_reader<setup::task_entry::flags_Enum_>::add(&local_50,Restart);
  }
  if (0x20005ff < (i->version).value) {
    stored_flag_reader<setup::task_entry::flags_Enum_>::add(&local_50,CheckedOnce);
  }
  if (0x40202ff < (i->version).value) {
    stored_flag_reader<setup::task_entry::flags_Enum_>::add(&local_50,DontInheritCheck);
  }
  if ((local_50.bytes == 3) && (local_50.pad_bits == 0x20)) {
    std::istream::read((char *)local_50.stream,(long)&local_51);
  }
  (this->options)._flags.super__Base_bitset<1UL>._M_w =
       (_WordT)local_50.result._flags.super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

void task_entry::load(std::istream & is, const info & i) {
	
	is >> util::encoded_string(name, i.codepage);
	is >> util::encoded_string(description, i.codepage);
	is >> util::encoded_string(group_description, i.codepage);
	is >> util::encoded_string(components, i.codepage);
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::encoded_string(languages, i.codepage);
	} else {
		languages.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 24))) {
		is >> util::encoded_string(check, i.codepage);
	} else {
		check.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(3, 0, 3))) {
		level = util::load<boost::int32_t>(is);
	} else {
		level = 0;
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(3, 0, 4))) {
		used = util::load_bool(is);
	} else {
		used = true;
	}
	
	winver.load(is, i.version);
	
	stored_flag_reader<flags> flagreader(is);
	
	flagreader.add(Exclusive);
	flagreader.add(Unchecked);
	if(i.version >= INNO_VERSION(2, 0, 5)) {
		flagreader.add(Restart);
	}
	if(i.version >= INNO_VERSION(2, 0, 6)) {
		flagreader.add(CheckedOnce);
	}
	if(i.version >= INNO_VERSION(4, 2, 3)) {
		flagreader.add(DontInheritCheck);
	}
	
	options = flagreader.finalize();
}